

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)4,(moira::Mode)5,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  int iVar1;
  Syntax SVar2;
  char *pcVar3;
  u64 value;
  char cVar4;
  long lVar5;
  Ea<(moira::Mode)5,_1> dst;
  u32 local_2c;
  ushort local_28;
  uint local_24;
  
  local_28 = op & 7;
  local_2c = *addr;
  *addr = local_2c + 2;
  local_24 = (*this->_vptr_Moira[6])();
  local_24 = local_24 & 0xffff;
  value = 8;
  if ((op & 0xe00) != 0) {
    value = (ulong)((byte)(op >> 9) & 7);
  }
  s = &str->ptr;
  if (str->style->syntax == MUSASHI) {
    cVar4 = 'a';
    lVar5 = 0;
    do {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "addq"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = 'b';
    }
    else {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar3 = *s;
        *s = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = ".b"[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    sprintd(s,value);
  }
  else {
    cVar4 = 'a';
    lVar5 = 0;
    do {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = cVar4;
      cVar4 = "addq"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if (str->style->syntax - MOIRA_MIT < 3) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = 'b';
    }
    else {
      cVar4 = '.';
      lVar5 = 0;
      do {
        pcVar3 = *s;
        *s = pcVar3 + 1;
        *pcVar3 = cVar4;
        cVar4 = ".b"[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 2);
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar3 = *s;
      *s = pcVar3 + 1;
      *pcVar3 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      do {
        pcVar3 = str->ptr;
        str->ptr = pcVar3 + 1;
        *pcVar3 = ' ';
      } while (str->ptr < str->base + iVar1);
    }
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = '#';
    StrWriter::operator<<(str,(Int)(i32)value);
  }
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar3 = *s;
    *s = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)5,_1> *)&local_2c);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src =          ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << dst;
    }
}